

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_true(lyxp_set **UNUSED_args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t UNUSED_arg_count_local;
  lyxp_set **UNUSED_args_local;
  
  if ((options & 0x1c) == 0) {
    set_fill_boolean(set,'\x01');
  }
  else {
    set_scnode_clear_ctx(set,0);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_true(struct lyxp_set **UNUSED(args), uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    set_fill_boolean(set, 1);
    return LY_SUCCESS;
}